

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeFunctionSet * __thiscall
ExpressionContext::GetFunctionSetType(ExpressionContext *this,ArrayView<TypeBase_*> setTypes)

{
  TypeFunctionSet *pTVar1;
  TypeBase *pTVar2;
  IntrusiveList<TypeHandle> types;
  IntrusiveList<TypeHandle> types_00;
  int iVar3;
  TypeBase **ppTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint i;
  uint index;
  uint uVar6;
  ulong uVar7;
  IntrusiveList<TypeHandle> *pIVar8;
  InplaceStr name;
  IntrusiveList<TypeHandle> setTypeList;
  ArrayView<TypeBase_*> setTypes_local;
  TypeFunctionSet *result;
  TypeHandle *pTVar5;
  
  setTypes_local.data = setTypes.data;
  setTypes_local.count = setTypes.count;
  uVar6 = (this->functionSetTypes).count;
  uVar7 = 0;
  do {
    if (uVar7 == uVar6) {
      setTypeList.head = (TypeHandle *)0x0;
      setTypeList.tail = (TypeHandle *)0x0;
      for (uVar6 = 0; uVar6 < setTypes_local.count; uVar6 = uVar6 + 1) {
        iVar3 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
        pTVar5 = (TypeHandle *)CONCAT44(extraout_var,iVar3);
        ppTVar4 = ArrayView<TypeBase_*>::operator[](&setTypes_local,uVar6);
        pTVar5->type = *ppTVar4;
        pTVar5->next = (TypeHandle *)0x0;
        pTVar5->listed = false;
        IntrusiveList<TypeHandle>::push_back(&setTypeList,pTVar5);
      }
      iVar3 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x70);
      types.tail = setTypeList.tail;
      types.head = setTypeList.head;
      name = GetFunctionSetTypeName(this,types);
      types_00.tail = setTypeList.tail;
      types_00.head = setTypeList.head;
      TypeFunctionSet::TypeFunctionSet
                ((TypeFunctionSet *)CONCAT44(extraout_var_00,iVar3),name,types_00);
      result = (TypeFunctionSet *)CONCAT44(extraout_var_00,iVar3);
      SmallArray<TypeFunctionSet_*,_128U>::push_back(&this->functionSetTypes,&result);
      return result;
    }
    pTVar1 = (this->functionSetTypes).data[uVar7];
    if (pTVar1 != (TypeFunctionSet *)0x0) {
      pIVar8 = &pTVar1->types;
      for (index = 0; pTVar5 = pIVar8->head, index < setTypes_local.count; index = index + 1) {
        if ((pTVar5 == (TypeHandle *)0x0) ||
           (pTVar2 = pTVar5->type,
           ppTVar4 = ArrayView<TypeBase_*>::operator[](&setTypes_local,index), pTVar2 != *ppTVar4))
        goto LAB_001bf694;
        pIVar8 = (IntrusiveList<TypeHandle> *)&pTVar5->next;
      }
      if (pTVar5 == (TypeHandle *)0x0) {
        return pTVar1;
      }
    }
LAB_001bf694:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

TypeFunctionSet* ExpressionContext::GetFunctionSetType(ArrayView<TypeBase*> setTypes)
{
	for(unsigned i = 0, e = functionSetTypes.count; i < e; i++)
	{
		if(TypeFunctionSet *type = functionSetTypes.data[i])
		{
			TypeHandle *leftArg = type->types.head;

			bool match = true;

			for(unsigned i = 0; i < setTypes.size(); i++)
			{
				if(!leftArg || leftArg->type != setTypes[i])
				{
					match = false;
					break;
				}

				leftArg = leftArg->next;
			}

			if(!match)
				continue;

			if(leftArg)
				continue;

			return type;
		}
	}

	IntrusiveList<TypeHandle> setTypeList;

	for(unsigned i = 0; i < setTypes.size(); i++)
		setTypeList.push_back(new (get<TypeHandle>()) TypeHandle(setTypes[i]));

	// Create new type
	TypeFunctionSet* result = new (get<TypeFunctionSet>()) TypeFunctionSet(GetFunctionSetTypeName(*this, setTypeList), setTypeList);

	functionSetTypes.push_back(result);

	// This type is not added to export list

	return result;
}